

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O2

base_learner * ect_setup(options_i *options,vw *all)

{
  int iVar1;
  option_group_definition *poVar2;
  typed_option<unsigned_long> *ptVar3;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ptVar4;
  size_t ws;
  base_learner *l;
  single_learner *base;
  learner<ect,_example> *plVar5;
  free_ptr<ect> data;
  string link;
  option_group_definition new_options;
  allocator local_557;
  allocator local_556;
  allocator local_555;
  allocator local_554;
  allocator local_553;
  allocator local_552;
  allocator local_551;
  free_ptr<ect> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  string local_520 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  string local_4e0;
  string local_4c0 [32];
  string local_4a0;
  string local_480 [32];
  string local_460;
  string local_440;
  option_group_definition local_420;
  undefined1 local_3e8 [112];
  bool local_378;
  typed_option<unsigned_long> local_348;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  typed_option<unsigned_long> local_168;
  typed_option<unsigned_long> local_c8;
  
  scoped_calloc_or_throw<ect>();
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  local_540._M_string_length = 0;
  local_540.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&local_440,"Error Correcting Tournament Options",(allocator *)local_3e8);
  VW::config::option_group_definition::option_group_definition(&local_420,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string((string *)&local_460,"ect",&local_551);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_3e8,&local_460,
             &(local_550._M_t.super___uniq_ptr_impl<ect,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ect_*,_void_(*)(void_*)>.super__Head_base<0UL,_ect_*,_false>.
              _M_head_impl)->k);
  local_378 = true;
  std::__cxx11::string::string(local_480,"Error correcting tournament with <k> labels",&local_552);
  std::__cxx11::string::_M_assign((string *)(local_3e8 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_c8,(typed_option<unsigned_long> *)local_3e8);
  poVar2 = VW::config::option_group_definition::add<unsigned_long>(&local_420,&local_c8);
  std::__cxx11::string::string((string *)&local_4a0,"error",&local_553);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_348,&local_4a0,
             &(local_550._M_t.super___uniq_ptr_impl<ect,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_ect_*,_void_(*)(void_*)>.super__Head_base<0UL,_ect_*,_false>.
              _M_head_impl)->errors);
  local_348.super_base_option.m_keep = true;
  ptVar3 = VW::config::typed_option<unsigned_long>::default_value(&local_348,0);
  std::__cxx11::string::string(local_4c0,"errors allowed by ECT",&local_554);
  std::__cxx11::string::_M_assign((string *)&(ptVar3->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_168,ptVar3);
  poVar2 = VW::config::option_group_definition::add<unsigned_long>(poVar2,&local_168);
  std::__cxx11::string::string((string *)&local_4e0,"link",&local_555);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_2a8,&local_4e0,&local_540);
  std::__cxx11::string::string((string *)&local_500,"identity",&local_556);
  ptVar4 = VW::config::
           typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::default_value(&local_2a8,&local_500);
  (ptVar4->super_base_option).m_keep = true;
  std::__cxx11::string::string
            (local_520,"Specify the link function: identity, logistic, glf1 or poisson",&local_557);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_208,ptVar4);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar2,&local_208);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_208);
  std::__cxx11::string::~string(local_520);
  std::__cxx11::string::~string((string *)&local_500);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_2a8);
  std::__cxx11::string::~string((string *)&local_4e0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_168);
  std::__cxx11::string::~string(local_4c0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_348);
  std::__cxx11::string::~string((string *)&local_4a0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_c8);
  std::__cxx11::string::~string(local_480);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_3e8);
  std::__cxx11::string::~string((string *)&local_460);
  (**options->_vptr_options_i)(options,&local_420);
  std::__cxx11::string::string((string *)local_3e8,"ect",(allocator *)&local_348);
  iVar1 = (*options->_vptr_options_i[1])(options,local_3e8);
  std::__cxx11::string::~string((string *)local_3e8);
  if ((char)iVar1 == '\0') {
    plVar5 = (learner<ect,_example> *)0x0;
  }
  else {
    ws = create_circuit(local_550._M_t.super___uniq_ptr_impl<ect,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_ect_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_ect_*,_false>._M_head_impl,
                        (local_550._M_t.super___uniq_ptr_impl<ect,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_ect_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_ect_*,_false>._M_head_impl)->k,
                        (local_550._M_t.super___uniq_ptr_impl<ect,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_ect_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_ect_*,_false>._M_head_impl)->errors + 1);
    l = setup_base(options,all);
    iVar1 = std::__cxx11::string::compare((char *)&local_540);
    if (iVar1 == 0) {
      (local_550._M_t.super___uniq_ptr_impl<ect,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_ect_*,_void_(*)(void_*)>.super__Head_base<0UL,_ect_*,_false>.
      _M_head_impl)->class_boundary = 0.5;
    }
    base = LEARNER::as_singleline<char,char>(l);
    plVar5 = LEARNER::init_multiclass_learner<ect,example,LEARNER::learner<char,example>>
                       (&local_550,base,learn,predict,all->p,ws,multiclass);
    *(undefined8 *)(plVar5 + 0xb8) = *(undefined8 *)(plVar5 + 0x18);
    *(undefined8 *)(plVar5 + 0xc0) = *(undefined8 *)(plVar5 + 0x20);
    *(code **)(plVar5 + 200) = finish;
  }
  VW::config::option_group_definition::~option_group_definition(&local_420);
  std::__cxx11::string::~string((string *)&local_540);
  std::unique_ptr<ect,_void_(*)(void_*)>::~unique_ptr(&local_550);
  return (base_learner *)plVar5;
}

Assistant:

base_learner* ect_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<ect>();
  std::string link;
  option_group_definition new_options("Error Correcting Tournament Options");
  new_options.add(make_option("ect", data->k).keep().help("Error correcting tournament with <k> labels"))
      .add(make_option("error", data->errors).keep().default_value(0).help("errors allowed by ECT"))
      // Used to check value. TODO replace
      .add(make_option("link", link)
               .default_value("identity")
               .keep()
               .help("Specify the link function: identity, logistic, glf1 or poisson"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("ect"))
    return nullptr;

  size_t wpp = create_circuit(*data.get(), data->k, data->errors + 1);

  base_learner* base = setup_base(options, all);
  if (link.compare("logistic") == 0)
    data->class_boundary = 0.5;  // as --link=logistic maps predictions in [0;1]

  learner<ect, example>& l = init_multiclass_learner(data, as_singleline(base), learn, predict, all.p, wpp);
  l.set_finish(finish);

  return make_base(l);
}